

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void kratos::GeneratorPortVisitor::process_port(Generator *generator,Port *port,string *port_name)

{
  uint32_t uVar1;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<std::pair<const_kratos::PortType,_kratos::VarCastType>_> __l_00;
  initializer_list<kratos::IRNode_*> __l_01;
  IRNode *pIVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  __node_base_ptr this_00;
  undefined8 uVar3;
  string *var_00;
  bool bVar4;
  byte bVar5;
  int iVar6;
  IRNodeKind IVar7;
  VarType VVar8;
  int iVar9;
  uint uVar10;
  size_type sVar11;
  element_type *peVar12;
  undefined4 extraout_var;
  Var **ppVVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  element_type *peVar14;
  uint32_t *puVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar16;
  bool *pbVar17;
  Var *pVVar18;
  element_type *peVar19;
  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  Generator *pGVar20;
  Generator *pGVar21;
  reference psVar22;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  element_type *peVar23;
  InternalException *this_02;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar24 [16];
  pair<const_char_*,_int> pVar25;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  allocator<char> local_4d1;
  string local_4d0;
  char *local_4b0;
  int local_4a8;
  int local_49c;
  pair<const_char_*,_int> local_498;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  local_481;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_480;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_478;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_470;
  undefined1 local_458 [8];
  shared_ptr<kratos::Var> var_1;
  Var *v_1;
  undefined1 local_430 [8];
  shared_ptr<kratos::PortPackedStruct> packed_1;
  string new_name_1;
  Generator *parent_1;
  undefined1 local_3f0 [16];
  pointer local_3e0;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_3d8;
  _Rb_tree_node_base local_3c0;
  undefined8 local_3a0;
  IRNode *ast_parent_1;
  Var *pVStack_390;
  bool correct_src_type_;
  Var *src_1;
  undefined1 local_380 [8];
  shared_ptr<kratos::AssignStmt> stmt_2;
  value_type *stmt_1;
  const_iterator __end4;
  const_iterator __begin4;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range4;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  sinks;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *sinks_;
  int local_2e4;
  pair<const_char_*,_int> local_2e0;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  local_2c9;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_2c8;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_2c0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_2b8;
  PortType local_29c;
  undefined1 local_298 [45];
  allocator<std::pair<const_kratos::PortType,_kratos::VarCastType>_> local_26b;
  key_equal local_26a;
  hasher local_269;
  undefined1 local_268 [24];
  pointer psStack_250;
  Param *local_240;
  __node_base local_238;
  undefined1 local_230 [24];
  Var *var;
  Var *v;
  undefined1 local_200 [8];
  shared_ptr<kratos::PortPackedStruct> packed;
  string new_name;
  Generator *parent;
  IRNode *local_1c0;
  iterator local_1b8;
  __node_base local_1b0;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_1a8;
  string local_190;
  undefined8 local_170;
  IRNode *ast_parent;
  shared_ptr<kratos::Stmt> local_158;
  Var *local_148;
  Var *src;
  __node_base local_138;
  value_type *stmt;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *sources;
  _Base_ptr p_Stack_120;
  PortDirection port_direction;
  string *port_name_local;
  Port *port_local;
  Generator *generator_local;
  pointer local_100;
  basic_string_view<char> local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_e8;
  undefined1 local_d0 [8];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char *local_c0;
  _Rb_tree_node_base *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_b0;
  Generator *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_a0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_98;
  __node_base local_90;
  undefined1 local_88 [16];
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  undefined1 local_50 [8];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  undefined1 local_38 [24];
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  Var *local_18;
  __node_base local_10;
  
  p_Stack_120 = (_Base_ptr)port_name;
  port_name_local = (string *)port;
  port_local = (Port *)generator;
  sources._4_4_ = Port::port_direction(port);
  if (sources._4_4_ == In) {
    stmt = (value_type *)(**(code **)(*(long *)port_name_local + 0x80))();
    sVar11 = std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::size((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                     *)stmt);
    if (sVar11 == 1) {
      src = (Var *)std::
                   unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                            *)stmt);
      local_138._M_nxt =
           (_Hash_node_base *)
           std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
           operator*((_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false> *)&src)
      ;
      peVar12 = std::
                __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_138._M_nxt);
      iVar6 = (*(peVar12->super_Stmt).super_IRNode._vptr_IRNode[4])();
      IVar7 = IRNode::ir_node_kind((IRNode *)CONCAT44(extraout_var,iVar6));
      if (IVar7 == GeneratorKind) {
        peVar12 = std::
                  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_138._M_nxt);
        ppVVar13 = AssignStmt::left(peVar12);
        if (*ppVVar13 == (Var *)port_name_local) {
          peVar12 = std::
                    __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_138._M_nxt);
          ppVVar13 = AssignStmt::right(peVar12);
          local_148 = *ppVVar13;
          bVar4 = correct_src_type(local_148,(Generator *)port_local);
          if (bVar4) {
LAB_00342fc6:
            iVar6 = (*(local_148->super_IRNode)._vptr_IRNode[0xd])();
            std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                      (&local_158,(shared_ptr<kratos::AssignStmt> *)local_138._M_nxt);
            Generator::remove_stmt((Generator *)CONCAT44(extraout_var_02,iVar6),&local_158);
            std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_158);
            return;
          }
          VVar8 = Var::type(local_148);
          if (VVar8 == Slice) {
            iVar6 = (*(local_148->super_IRNode)._vptr_IRNode[0xd])();
            iVar9 = (*(port_local->super_Var).super_IRNode._vptr_IRNode[4])();
            if (CONCAT44(extraout_var_00,iVar6) == CONCAT44(extraout_var_01,iVar9))
            goto LAB_00342fc6;
          }
        }
      }
    }
    iVar6 = (*(port_local->super_Var).super_IRNode._vptr_IRNode[4])();
    pGVar20 = (Generator *)CONCAT44(extraout_var_03,iVar6);
    local_170 = pGVar20;
    if (pGVar20 != (Generator *)0x0) {
      Generator::get_unique_variable_name
                ((string *)
                 &packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,pGVar20,(string *)&(port_local->super_Var).var_width_,
                 (string *)p_Stack_120);
      bVar5 = (**(code **)(*(long *)port_name_local + 0xb8))();
      if ((bVar5 & 1) == 0) {
        puVar15 = Var::var_width((Var *)port_name_local);
        uVar1 = *puVar15;
        pvVar16 = Var::size((Var *)port_name_local);
        pbVar17 = Var::is_signed((Var *)port_name_local);
        pVVar18 = Generator::var(pGVar20,(string *)
                                         &packed.
                                          super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount,uVar1,pvVar16,(bool)(*pbVar17 & 1));
        var = pVVar18;
        bVar5 = (**(code **)(*(long *)port_name_local + 0xc0))();
        (*(pVVar18->super_IRNode)._vptr_IRNode[0x19])(pVVar18,(ulong)(bVar5 & 1));
        pVVar18 = var;
        bVar4 = Var::explicit_array((Var *)port_name_local);
        Var::set_explicit_array(pVVar18,bVar4);
      }
      else {
        Var::as<kratos::PortPackedStruct>((Var *)local_200);
        peVar14 = std::
                  __shared_ptr_access<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_200);
        (*(peVar14->super_Port).super_Var.super_IRNode._vptr_IRNode[0x2e])(&v);
        Generator::var_packed
                  (pGVar20,(string *)
                           &packed.
                            super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,(shared_ptr<kratos::PackedStruct> *)&v);
        std::shared_ptr<kratos::PackedStruct>::~shared_ptr((shared_ptr<kratos::PackedStruct> *)&v);
        std::shared_ptr<kratos::PortPackedStruct>::~shared_ptr
                  ((shared_ptr<kratos::PortPackedStruct> *)local_200);
      }
      Generator::get_var((Generator *)local_230,(string *)pGVar20);
      peVar19 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_230);
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_230);
      local_230._16_8_ = peVar19;
      if ((process_port(kratos::Generator*,kratos::Port*,std::__cxx11::string_const&)::cast_maps ==
           '\0') &&
         (iVar6 = __cxa_guard_acquire(&process_port(kratos::Generator*,kratos::Port*,std::__cxx11::string_const&)
                                       ::cast_maps), iVar6 != 0)) {
        local_268._16_8_ = 0x500000003;
        psStack_250 = (pointer)0x400000004;
        local_268._0_4_ = Clock;
        local_268._4_4_ = Clock;
        local_268._8_8_ = 0x300000002;
        local_240 = (Param *)local_268;
        local_238._M_nxt = (_Hash_node_base *)0x4;
        std::allocator<std::pair<const_kratos::PortType,_kratos::VarCastType>_>::allocator
                  (&local_26b);
        __l_00._M_len = (size_type)local_238._M_nxt;
        __l_00._M_array = (iterator)local_240;
        std::
        unordered_map<kratos::PortType,_kratos::VarCastType,_std::hash<kratos::PortType>,_std::equal_to<kratos::PortType>,_std::allocator<std::pair<const_kratos::PortType,_kratos::VarCastType>_>_>
        ::unordered_map(&process_port::cast_maps,__l_00,0,&local_269,&local_26a,&local_26b);
        std::allocator<std::pair<const_kratos::PortType,_kratos::VarCastType>_>::~allocator
                  (&local_26b);
        __cxa_atexit(std::
                     unordered_map<kratos::PortType,_kratos::VarCastType,_std::hash<kratos::PortType>,_std::equal_to<kratos::PortType>,_std::allocator<std::pair<const_kratos::PortType,_kratos::VarCastType>_>_>
                     ::~unordered_map,&process_port::cast_maps,&__dso_handle);
        __cxa_guard_release(&process_port(kratos::Generator*,kratos::Port*,std::__cxx11::string_const&)
                             ::cast_maps);
      }
      local_298._28_4_ = Port::port_type((Port *)port_name_local);
      local_298._32_8_ =
           std::
           unordered_map<kratos::PortType,_kratos::VarCastType,_std::hash<kratos::PortType>,_std::equal_to<kratos::PortType>,_std::allocator<std::pair<const_kratos::PortType,_kratos::VarCastType>_>_>
           ::find(&process_port::cast_maps,(key_type *)(local_298 + 0x1c));
      local_298._16_8_ =
           std::
           unordered_map<kratos::PortType,_kratos::VarCastType,_std::hash<kratos::PortType>,_std::equal_to<kratos::PortType>,_std::allocator<std::pair<const_kratos::PortType,_kratos::VarCastType>_>_>
           ::end(&process_port::cast_maps);
      bVar4 = std::__detail::operator!=
                        ((_Node_iterator_base<std::pair<const_kratos::PortType,_kratos::VarCastType>,_false>
                          *)(local_298 + 0x20),
                         (_Node_iterator_base<std::pair<const_kratos::PortType,_kratos::VarCastType>,_false>
                          *)(local_298 + 0x10));
      uVar3 = local_230._16_8_;
      if (bVar4) {
        local_29c = Port::port_type((Port *)port_name_local);
        std::
        unordered_map<kratos::PortType,_kratos::VarCastType,_std::hash<kratos::PortType>,_std::equal_to<kratos::PortType>,_std::allocator<std::pair<const_kratos::PortType,_kratos::VarCastType>_>_>
        ::at(&process_port::cast_maps,&local_29c);
        Var::cast((Var *)local_298,(VarCastType)uVar3);
        local_230._16_8_ =
             std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_298);
        std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_298);
      }
      if ((pGVar20->debug & 1U) != 0) {
        local_2c0._M_current =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&port_name_local->_M_string_length);
        local_2c8._M_current =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)&port_name_local->_M_string_length);
        std::
        allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
        ::allocator(&local_2c9);
        std::
        vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
        ::
        vector<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
                  ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                    *)&local_2b8,local_2c0,local_2c8,&local_2c9);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::operator=(&((IRNode *)local_230._16_8_)->fn_name_ln,&local_2b8);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::~vector(&local_2b8);
        std::
        allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
        ::~allocator(&local_2c9);
        pIVar2 = (IRNode *)local_230._16_8_;
        local_2e4 = 0x194;
        pVar25 = std::make_pair<char_const(&)[82],int>
                           ((char (*) [82])
                            "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/transform.cc"
                            ,&local_2e4);
        local_2e0.first = pVar25.first;
        local_2e0.second = pVar25.second;
        std::
        vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
        ::emplace_back<std::pair<char_const*,int>>
                  ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                    *)&pIVar2->fn_name_ln,&local_2e0);
      }
      Var::move_src_to((Var *)port_name_local,(Var *)local_230._16_8_,pGVar20,true);
      std::__cxx11::string::~string
                ((string *)
                 &packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return;
    }
    parent._6_1_ = 1;
    auVar24 = __cxa_allocate_exception(0x10);
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&(port_local->super_Var).name;
    local_38._0_8_ = &local_190;
    local_40 = "{0}\'s parent is empty but it\'s not a top module";
    local_68.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string&,char[48],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"{0}\'s parent is empty but it\'s not a top module",(v7 *)vargs,auVar24._8_8_
                    ,(remove_reference_t<std::__cxx11::basic_string<char>_&> *)
                     "{0}\'s parent is empty but it\'s not a top module");
    local_50 = (undefined1  [8])&local_68;
    local_78 = fmt::v7::to_string_view<char,_0>(local_40);
    local_38._16_8_ = local_88;
    local_38._8_8_ = local_50;
    local_20 = (anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
                *)local_50;
    local_10._M_nxt = (_Hash_node_base *)local_50;
    local_18 = (Var *)local_38._16_8_;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_38._16_8_,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_50);
    format_str.size_ = local_88._0_8_;
    format_str.data_ = (char *)local_78.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = local_88._8_8_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_190,(detail *)local_78.data_,format_str,args);
    local_1c0 = (IRNode *)port_local;
    local_1b8 = &local_1c0;
    local_1b0._M_nxt = (_Hash_node_base *)0x1;
    std::allocator<kratos::IRNode_*>::allocator((allocator<kratos::IRNode_*> *)((long)&parent + 7));
    __l_01._M_len = (size_type)local_1b0._M_nxt;
    __l_01._M_array = local_1b8;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              (&local_1a8,__l_01,(allocator<kratos::IRNode_*> *)((long)&parent + 7));
    GeneratorException::GeneratorException(auVar24._0_8_,&local_190,&local_1a8);
    parent._6_1_ = 0;
    __cxa_throw(auVar24._0_8_,&GeneratorException::typeinfo,GeneratorException::~GeneratorException)
    ;
  }
  if (sources._4_4_ != Out) {
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d0,"Not implement yet",&local_4d1);
    InternalException::InternalException(this_02,&local_4d0);
    __cxa_throw(this_02,&InternalException::typeinfo,InternalException::~InternalException);
  }
  sinks._M_h._M_single_bucket = (__node_base_ptr)(**(code **)(*(long *)port_name_local + 0x70))();
  std::
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  ::unordered_set((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   *)&__range4);
  this_00 = sinks._M_h._M_single_bucket;
  __end4 = std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    *)sinks._M_h._M_single_bucket);
  stmt_1 = (value_type *)
           std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                  *)this_00);
  while (bVar4 = std::__detail::operator!=
                           (&__end4.
                             super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>,
                            (_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> *)
                            &stmt_1), bVar4) {
    this_01 = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>
              ::operator*(&__end4);
    peVar12 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_01);
    pGVar20 = Stmt::generator_parent(&peVar12->super_Stmt);
    pGVar21 = (Generator *)(**(code **)(*(long *)port_name_local + 0x68))();
    pGVar21 = Generator::parent_generator(pGVar21);
    if (pGVar20 == pGVar21) {
      std::
      unordered_set<std::shared_ptr<kratos::AssignStmt>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
      ::emplace<std::shared_ptr<kratos::AssignStmt>const&>
                ((unordered_set<std::shared_ptr<kratos::AssignStmt>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
                  *)&__range4,(shared_ptr<kratos::AssignStmt> *)this_01);
    }
    std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
    operator++(&__end4);
  }
  bVar4 = std::
          unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
          ::empty((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   *)&__range4);
  if (bVar4) {
    stmt_2.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 1;
    goto LAB_0034432a;
  }
  sVar11 = std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::size((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   *)&__range4);
  if (sVar11 == 1) {
    src_1 = (Var *)std::
                   unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                            *)&__range4);
    psVar22 = std::__detail::_Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
              operator*((_Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false> *)&src_1);
    std::shared_ptr<kratos::AssignStmt>::shared_ptr
              ((shared_ptr<kratos::AssignStmt> *)local_380,psVar22);
    peVar12 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_380);
    ppVVar13 = AssignStmt::left(peVar12);
    pVStack_390 = *ppVVar13;
    uVar10 = (*(pVStack_390->super_IRNode)._vptr_IRNode[0x1d])();
    if ((uVar10 & 1) == 0) {
      ast_parent_1._7_1_ = correct_src_type(pVStack_390,(Generator *)port_local);
    }
    else {
      ast_parent_1._7_1_ = true;
    }
    peVar12 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_380);
    iVar6 = (*(peVar12->super_Stmt).super_IRNode._vptr_IRNode[4])();
    IVar7 = IRNode::ir_node_kind((IRNode *)CONCAT44(extraout_var_04,iVar6));
    if ((IVar7 == GeneratorKind) && ((ast_parent_1._7_1_ & 1) != 0)) {
      iVar6 = (*(pVStack_390->super_IRNode)._vptr_IRNode[0xd])();
      iVar9 = (*(port_local->super_Var).super_IRNode._vptr_IRNode[4])();
      if (CONCAT44(extraout_var_05,iVar6) != CONCAT44(extraout_var_06,iVar9)) goto LAB_00343c06;
      peVar12 = std::
                __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_380);
      ppVVar13 = AssignStmt::right(peVar12);
      if (*ppVVar13 != (Var *)port_name_local) goto LAB_00343c06;
      peVar12 = std::
                __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_380);
      (*(peVar12->super_Stmt).super_IRNode._vptr_IRNode[9])();
      stmt_2.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = 1;
    }
    else {
LAB_00343c06:
      stmt_2.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = 0;
    }
    std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_380);
    if (stmt_2.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ != 0) goto LAB_0034432a;
  }
  iVar6 = (*(port_local->super_Var).super_IRNode._vptr_IRNode[4])();
  pGVar20 = (Generator *)CONCAT44(extraout_var_07,iVar6);
  local_3a0 = pGVar20;
  if (pGVar20 == (Generator *)0x0) {
    parent_1._6_1_ = 1;
    auVar24 = __cxa_allocate_exception(0x10);
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&(port_local->super_Var).name;
    local_b8 = &local_3c0;
    local_c0 = "{0}\'s parent is empty but it\'s not a top module";
    local_e8._M_allocated_capacity =
         (size_type)
         fmt::v7::make_args_checked<std::__cxx11::string&,char[48],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"{0}\'s parent is empty but it\'s not a top module",(v7 *)vargs_1,
                    auVar24._8_8_,
                    (remove_reference_t<std::__cxx11::basic_string<char>_&> *)
                    "{0}\'s parent is empty but it\'s not a top module");
    local_d0 = (undefined1  [8])&local_e8;
    local_f8 = fmt::v7::to_string_view<char,_0>(local_c0);
    local_a8 = (Generator *)&generator_local;
    local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                *)local_d0;
    local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                *)local_d0;
    local_90._M_nxt = (_Hash_node_base *)local_d0;
    local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_a8,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_d0);
    format_str_00.size_ = (size_t)generator_local;
    format_str_00.data_ = (char *)local_f8.size_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_100;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)&local_3c0,(detail *)local_f8.data_,format_str_00,args_00);
    local_3f0._0_8_ = port_local;
    local_3f0._8_8_ = local_3f0;
    local_3e0 = (pointer)0x1;
    std::allocator<kratos::IRNode_*>::allocator
              ((allocator<kratos::IRNode_*> *)((long)&parent_1 + 7));
    __l._M_len = (size_type)local_3e0;
    __l._M_array = (iterator)local_3f0._8_8_;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              (&local_3d8,__l,(allocator<kratos::IRNode_*> *)((long)&parent_1 + 7));
    GeneratorException::GeneratorException(auVar24._0_8_,(string *)&local_3c0,&local_3d8);
    parent_1._6_1_ = 0;
    __cxa_throw(auVar24._0_8_,&GeneratorException::typeinfo,GeneratorException::~GeneratorException)
    ;
  }
  Generator::get_unique_variable_name
            ((string *)
             &packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pGVar20,(string *)&(port_local->super_Var).var_width_,
             (string *)p_Stack_120);
  bVar5 = (**(code **)(*(long *)port_name_local + 0xb8))();
  if ((bVar5 & 1) == 0) {
    puVar15 = Var::var_width((Var *)port_name_local);
    uVar1 = *puVar15;
    pvVar16 = Var::size((Var *)port_name_local);
    pbVar17 = Var::is_signed((Var *)port_name_local);
    pVVar18 = Generator::var(pGVar20,(string *)
                                     &packed_1.
                                      super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,uVar1,pvVar16,(bool)(*pbVar17 & 1));
    var_1.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVVar18;
    bVar5 = (**(code **)(*(long *)port_name_local + 0xc0))();
    (*(pVVar18->super_IRNode)._vptr_IRNode[0x19])(pVVar18,(ulong)(bVar5 & 1));
    this = var_1.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    bVar4 = Var::explicit_array((Var *)port_name_local);
    Var::set_explicit_array((Var *)this._M_pi,bVar4);
  }
  else {
    Var::as<kratos::PortPackedStruct>((Var *)local_430);
    peVar14 = std::
              __shared_ptr_access<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_430);
    (*(peVar14->super_Port).super_Var.super_IRNode._vptr_IRNode[0x2e])(&v_1);
    Generator::var_packed
              (pGVar20,(string *)
                       &packed_1.
                        super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(shared_ptr<kratos::PackedStruct> *)&v_1);
    std::shared_ptr<kratos::PackedStruct>::~shared_ptr((shared_ptr<kratos::PackedStruct> *)&v_1);
    std::shared_ptr<kratos::PortPackedStruct>::~shared_ptr
              ((shared_ptr<kratos::PortPackedStruct> *)local_430);
  }
  Generator::get_var((Generator *)local_458,(string *)pGVar20);
  if ((pGVar20->debug & 1U) != 0) {
    local_478._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     *)&port_name_local->_M_string_length);
    local_480._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)&port_name_local->_M_string_length);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
    ::allocator(&local_481);
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::
    vector<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&local_470,local_478,local_480,&local_481);
    peVar23 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_458);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::operator=(&(peVar23->super_IRNode).fn_name_ln,&local_470);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~vector(&local_470);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
    ::~allocator(&local_481);
    peVar23 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_458);
    local_49c = 0x1cd;
    pVar25 = std::make_pair<char_const(&)[82],int>
                       ((char (*) [82])
                        "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/transform.cc"
                        ,&local_49c);
    local_4b0 = pVar25.first;
    local_4a8 = pVar25.second;
    local_498.first = local_4b0;
    local_498.second = local_4a8;
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&(peVar23->super_IRNode).fn_name_ln,&local_498);
  }
  var_00 = port_name_local;
  peVar19 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_458);
  Var::move_sink_to((Var *)var_00,peVar19,pGVar20,true);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_458);
  std::__cxx11::string::~string
            ((string *)
             &packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  stmt_2.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
       = 0;
LAB_0034432a:
  std::
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  ::~unordered_set((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    *)&__range4);
  return;
}

Assistant:

static void process_port(Generator* generator, Port* port, const std::string& port_name) {
        auto const port_direction = port->port_direction();
        if (port_direction == PortDirection::In) {
            const auto& sources = port->sources();
            // unless it's driven by a single var or port, we need to duplicate
            // the variable
            if (sources.size() == 1) {
                const auto& stmt = *sources.begin();
                if (stmt->parent()->ir_node_kind() == IRNodeKind::GeneratorKind &&
                    stmt->left() == port) {
                    // the sink has to be it self
                    auto* src = stmt->right();
                    if (correct_src_type(src, generator) ||
                        // here we are okay with input sliced in
                        (src->type() == VarType::Slice &&
                         src->generator() == generator->parent())) {
                        // remove it from the parent generator
                        src->generator()->remove_stmt(stmt);
                        return;
                    }
                }
            }
            // create a new variable
            auto* ast_parent = generator->parent();
            if (!ast_parent)
                throw GeneratorException(
                    ::format("{0}'s parent is empty but it's not a top module", generator->name),
                    {generator});
            auto* parent = reinterpret_cast<Generator*>(ast_parent);
            auto new_name = parent->get_unique_variable_name(generator->instance_name, port_name);
            if (port->is_struct()) {
                auto packed = port->as<PortPackedStruct>();
                parent->var_packed(new_name, packed->packed_struct());
            } else {
                auto& v = parent->var(new_name, port->var_width(), port->size(), port->is_signed());
                v.set_is_packed(port->is_packed());
                v.set_explicit_array(port->explicit_array());
            }
            Var* var = parent->get_var(new_name).get();
            // be careful about the port type. if it's special type, it needs properly casted
            const static std::unordered_map<PortType, VarCastType> cast_maps = {
                {PortType::Clock, VarCastType::Clock},
                {PortType::AsyncReset, VarCastType::AsyncReset},
                {PortType::Reset, VarCastType::Reset},
                {PortType::ClockEnable, VarCastType::ClockEnable}};
            if (cast_maps.find(port->port_type()) != cast_maps.end()) {
                var = var->cast(cast_maps.at(port->port_type())).get();
            }
            if (parent->debug) {
                // need to copy over the changes over
                var->fn_name_ln = std::vector<std::pair<std::string, uint32_t>>(
                    port->fn_name_ln.begin(), port->fn_name_ln.end());
                var->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
            }
            // replace all the sources
            Var::move_src_to(port, var, parent, true);
        } else if (port_direction == PortDirection::Out) {
            // same logic as the port dir in
            // if we're connected to a base variable, we are good
            const auto& sinks_ = port->sinks();
            // we are only interested in parent level port connection
            std::unordered_set<std::shared_ptr<AssignStmt>> sinks;
            for (auto const& stmt : sinks_) {
                if (stmt->generator_parent() == port->generator()->parent_generator())
                    sinks.emplace(stmt);
            }
            if (sinks.empty()) {
                return;
            }
            // special case where if the sink is parent's port, this is fine
            if (sinks.size() == 1) {
                auto stmt = *(sinks.begin());
                auto* src = stmt->left();
                bool correct_src_type_;
                if (!src->is_interface()) {
                    // as long as it is not an expression, it is fine
                    correct_src_type_ = correct_src_type(src, generator);
                } else {
                    correct_src_type_ = true;
                }
                if (stmt->parent()->ir_node_kind() == IRNodeKind::GeneratorKind &&
                    correct_src_type_ && src->generator() == generator->parent() &&
                    stmt->right() == port) {
                    // remove it from the parent generator
                    stmt->remove_from_parent();
                    return;
                }
            }
            // create a new variable
            auto* ast_parent = generator->parent();
            if (!ast_parent)
                throw GeneratorException(
                    ::format("{0}'s parent is empty but it's not a top module", generator->name),
                    {generator});
            auto* parent = reinterpret_cast<Generator*>(ast_parent);
            auto new_name = parent->get_unique_variable_name(generator->instance_name, port_name);
            if (port->is_struct()) {
                auto packed = port->as<PortPackedStruct>();
                parent->var_packed(new_name, packed->packed_struct());
            } else {
                auto& v = parent->var(new_name, port->var_width(), port->size(), port->is_signed());
                v.set_is_packed(port->is_packed());
                v.set_explicit_array(port->explicit_array());
            }
            auto var = parent->get_var(new_name);
            if (parent->debug) {
                // need to copy over the changes over
                var->fn_name_ln = std::vector<std::pair<std::string, uint32_t>>(
                    port->fn_name_ln.begin(), port->fn_name_ln.end());
                var->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
            }
            // replace all the sources
            Var::move_sink_to(port, var.get(), parent, true);
        } else {
            throw InternalException("Not implement yet");
        }
    }